

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

int __thiscall
CVmDynamicFunc::index_val_q
          (CVmDynamicFunc *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *index_val)

{
  vm_dynfunc_ext *pvVar1;
  int *in_RCX;
  undefined8 *in_RSI;
  CVmDynamicFunc *in_RDI;
  
  if ((*in_RCX == 7) && (in_RCX[2] == 1)) {
    pvVar1 = get_ext(in_RDI);
    *in_RSI = *(undefined8 *)&pvVar1->method_ctx;
    *(anon_union_8_8_cb74652f_for_val *)(in_RSI + 1) = (pvVar1->method_ctx).val;
    return 1;
  }
  err_throw(0);
}

Assistant:

int CVmDynamicFunc::index_val_q(VMG_ vm_val_t *result,
                                vm_obj_id_t self,
                                const vm_val_t *index_val)
{
    /* check the type */
    if (index_val->typ == VM_INT)
    {
        /* it's an integer index - check the value */
        switch (index_val->val.intval)
        {
        case 1:
            /* return our method context */
            *result = get_ext()->method_ctx;
            return TRUE;

        default:
            /* other values are not allowed */
            break;
        }
    }

    /* if we didn't handle it already, it's an invalid index */
    err_throw(VMERR_INDEX_OUT_OF_RANGE);
    AFTER_ERR_THROW(return TRUE;)
}